

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O3

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::InitFromFile(KLVFilePacket *this,IFileReader *Reader)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  ILogSink *pIVar4;
  int64_t iVar5;
  IFileReader *in_RDX;
  uint uVar6;
  undefined1 *puVar7;
  ui32_t read_count;
  byte_t tmp_data [32];
  ui64_t tmp_size;
  ui64Printer tmp_size_str;
  Result_t result;
  uint local_12c;
  undefined4 local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  uint local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  ulong local_108;
  undefined1 local_100 [32];
  char *local_e0;
  char local_d8 [64];
  int local_98 [26];
  
  *(undefined8 *)(Reader + 8) = 0;
  *(undefined4 *)(Reader + 0x10) = 0;
  *(undefined4 *)(Reader + 0x60) = 0;
  *(undefined8 *)(Reader + 0x18) = 0;
  *(undefined8 *)(Reader + 0x20) = 0;
  puVar7 = (undefined1 *)local_98;
  (**(code **)(*(long *)in_RDX + 0x38))(puVar7);
  if (-1 < local_98[0]) {
    if (local_12c < 0x11) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"Short read of Key and Length got %u\n",(ulong)local_12c);
      puVar7 = Kumu::RESULT_READFAIL;
    }
    else {
      if (local_128 == 0x342b0e06) {
        cVar2 = Kumu::read_BER((uchar *)&local_118,&local_108);
        if (cVar2 != '\0') {
          iVar3 = 0;
          if ((local_118 & 0xf0) == 0x80) {
            iVar3 = (local_118 & 0xf) + 1;
          }
          *(int *)(Reader + 0x10) = iVar3 + 0x10;
          if (local_108 < 0x4000001) {
            *(ulong *)(Reader + 0x20) = local_108;
            uVar6 = iVar3 + 0x10 + (int)local_108;
            FrameBuffer::Capacity((FrameBuffer *)local_100,(int)Reader + 0x48);
            puVar7 = (undefined1 *)local_98;
            Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)local_100);
            Kumu::Result_t::~Result_t((Result_t *)local_100);
            if (-1 < local_98[0]) {
              piVar1 = *(int **)(Reader + 0x50);
              *(int **)(Reader + 8) = piVar1;
              *(ulong *)(Reader + 0x18) = (ulong)*(uint *)(Reader + 0x10) + (long)piVar1;
              *(uint *)(Reader + 0x60) = uVar6;
              if (uVar6 < 0x21) {
                if (local_12c < uVar6) {
                  __assert_fail("packet_length <= read_count",
                                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                                ,0x111,
                                "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                               );
                }
                memcpy(piVar1,&local_128,(ulong)uVar6);
                if (local_12c - uVar6 != 0) {
                  pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Warn(pIVar4,"Repositioning pointer for short packet\n");
                  iVar5 = Kumu::IFileReader::TellPosition(in_RDX);
                  if (iVar5 <= (long)(ulong)(local_12c - uVar6)) {
                    __assert_fail("pos > remainder",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                                  ,0x118,
                                  "virtual ASDCP::Result_t ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader &)"
                                 );
                  }
                  (**(code **)(*(long *)in_RDX + 0x28))(local_100);
                  puVar7 = (undefined1 *)local_98;
                  Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)local_100);
                  Kumu::Result_t::~Result_t((Result_t *)local_100);
                }
              }
              else if (local_12c < 0x20) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error
                          (pIVar4,"Short read of packet body, expecting %u, got %u\n",
                           (ulong)*(uint *)(Reader + 0x60),(ulong)local_12c);
                puVar7 = Kumu::RESULT_READFAIL;
              }
              else {
                piVar1[4] = local_118;
                piVar1[5] = iStack_114;
                piVar1[6] = iStack_110;
                piVar1[7] = iStack_10c;
                *piVar1 = local_128;
                piVar1[1] = iStack_124;
                piVar1[2] = iStack_120;
                piVar1[3] = iStack_11c;
                uVar6 = *(uint *)(Reader + 0x60);
                if (uVar6 != 0x20) {
                  (**(code **)(*(long *)in_RDX + 0x38))(local_100);
                  puVar7 = (undefined1 *)local_98;
                  Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)local_100);
                  Kumu::Result_t::~Result_t((Result_t *)local_100);
                  if (local_12c != uVar6 - 0x20) {
                    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                    Kumu::ILogSink::Error
                              (pIVar4,"Short read of packet body, expecting %u, got %u\n",
                               (ulong)uVar6,(ulong)(local_12c + 0x20));
                    puVar7 = (undefined1 *)local_98;
                    Kumu::Result_t::operator=((Result_t *)puVar7,(Result_t *)Kumu::RESULT_READFAIL);
                  }
                }
              }
            }
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
          }
          else {
            (**(code **)(*(long *)in_RDX + 0x28))(local_100);
            Kumu::Result_t::operator=((Result_t *)local_98,(Result_t *)local_100);
            Kumu::Result_t::~Result_t((Result_t *)local_100);
            if (-1 < local_98[0]) {
              piVar1 = *(int **)(Reader + 0x50);
              *piVar1 = local_128;
              piVar1[1] = iStack_124;
              piVar1[2] = iStack_120;
              piVar1[3] = iStack_11c;
              *(undefined8 *)(Reader + 8) = *(undefined8 *)(Reader + 0x50);
              local_100._8_8_ = (byte_t *)0x0;
              local_100[0x10] = 0;
              local_e0 = "%qu";
              local_100._0_8_ = local_100 + 0x10;
              snprintf(local_d8,0x20,"%qu",local_108);
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error(pIVar4,"Packet length %s exceeds internal limit.\n",local_d8);
              Kumu::Result_t::operator=((Result_t *)local_98,(Result_t *)Kumu::RESULT_ALLOC);
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_,
                                CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
              }
            }
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_98);
          }
          goto LAB_0019f7eb;
        }
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar4,"BER Length decoding error\n");
      }
      else {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar4,"Unexpected UL preamble: %02x.%02x.%02x.%02x\n",(ulong)(byte)local_128,
                   (ulong)local_128._1_1_,(ulong)local_128._2_1_,(ulong)local_128._3_1_);
      }
      puVar7 = Kumu::RESULT_FAIL;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
LAB_0019f7eb:
  Kumu::Result_t::~Result_t((Result_t *)local_98);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader& Reader)
{
  ui32_t read_count;
  byte_t tmp_data[tmp_read_size];
  ui64_t tmp_size;
  m_KeyStart = m_ValueStart = 0;
  m_KLLength = m_ValueLength = 0;
  m_Buffer.Size(0);

  Result_t result = Reader.Read(tmp_data, tmp_read_size, &read_count);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( read_count < (SMPTE_UL_LENGTH + 1) )
    {
      DefaultLogSink().Error("Short read of Key and Length got %u\n", read_count);
      return RESULT_READFAIL;
    }

  if ( memcmp(tmp_data, SMPTE_UL_START, 4) != 0 )
    {
      DefaultLogSink().Error("Unexpected UL preamble: %02x.%02x.%02x.%02x\n",
			     tmp_data[0], tmp_data[1], tmp_data[2], tmp_data[3]);
      return RESULT_FAIL;
    }

  if ( ! Kumu::read_BER(tmp_data + SMPTE_UL_LENGTH, &tmp_size) )
    {
      DefaultLogSink().Error("BER Length decoding error\n");
      return RESULT_FAIL;
    }

  ui32_t ber_len = Kumu::BER_length(tmp_data + SMPTE_UL_LENGTH);
  m_KLLength = SMPTE_UL_LENGTH + ber_len;

  if ( tmp_size > MAX_KLV_PACKET_LENGTH )
    {
      result = Reader.Seek(tmp_size - (tmp_read_size - SMPTE_UL_LENGTH - ber_len), Kumu::SP_POS);

      if ( ASDCP_SUCCESS(result) )
        {
          memcpy(m_Buffer.Data(), tmp_data, SMPTE_UL_LENGTH);
          m_KeyStart = m_Buffer.Data();

          Kumu::ui64Printer tmp_size_str(tmp_size);
          DefaultLogSink().Error("Packet length %s exceeds internal limit.\n", tmp_size_str.c_str());
          result = RESULT_ALLOC;
        }

      return result;
    }

  ui32_t remainder = 0;
  assert(tmp_size <= 0xFFFFFFFFL);
  m_ValueLength = (ui32_t) tmp_size;
  ui32_t packet_length = m_ValueLength + m_KLLength;

  result = m_Buffer.Capacity(packet_length);

  if ( ASDCP_FAILURE(result) )
    return result;

  m_KeyStart = m_Buffer.Data();
  m_ValueStart = m_Buffer.Data() + m_KLLength;
  m_Buffer.Size(packet_length);

  // is the whole packet in the tmp buf?
  if ( packet_length <= tmp_read_size )
    {
      assert(packet_length <= read_count);
      memcpy(m_Buffer.Data(), tmp_data, packet_length);

      if ( (remainder = read_count - packet_length) != 0 )
	{
	  DefaultLogSink().Warn("Repositioning pointer for short packet\n");
	  Kumu::fpos_t pos = Reader.TellPosition();
	  assert(pos > remainder);
	  result = Reader.Seek(pos - remainder);
	}
    }
  else
    {
      if ( read_count < tmp_read_size )
	{
	  DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				 m_Buffer.Size(), read_count);
	  return RESULT_READFAIL;
	}

      memcpy(m_Buffer.Data(), tmp_data, tmp_read_size);
      remainder = m_Buffer.Size() - tmp_read_size;

      if ( remainder > 0 )
	{
	  result = Reader.Read(m_Buffer.Data() + tmp_read_size, remainder, &read_count);
      
	  if ( read_count != remainder )
	    {
	      DefaultLogSink().Error("Short read of packet body, expecting %u, got %u\n",
				     remainder+tmp_read_size, read_count+tmp_read_size);
	      result = RESULT_READFAIL;
	    }
	}
    }

  return result;
}